

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.h
# Opt level: O3

GradientPoint *
GradientPoint::fromRGB(GradientPoint *__return_storage_ptr__,float u,float r,float g,float b)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  float fVar6;
  uint uVar8;
  float fVar9;
  double dVar7;
  undefined4 in_XMM2_Db;
  float fVar10;
  undefined4 in_XMM3_Db;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  
  __return_storage_ptr__->units = u;
  bVar4 = -(1.0 < r) | -(1.0 < g);
  auVar11._4_4_ = b;
  auVar11._0_4_ = g;
  auVar11._8_4_ = in_XMM2_Db;
  auVar11._12_4_ = in_XMM3_Db;
  auVar11 = divps(auVar11,_DAT_001ae060);
  uVar2 = (uint)(1.0 < b | bVar4);
  uVar5 = (int)(uVar2 << 0x1f) >> 0x1f;
  uVar8 = (int)(uVar2 << 0x1f) >> 0x1f;
  fVar6 = (float)(~uVar5 & (uint)g | auVar11._0_4_ & uVar5);
  fVar9 = (float)(~uVar8 & (uint)b | auVar11._4_4_ & uVar8);
  if (1.0 < b || (bVar4 & 1) != 0) {
    r = r / 255.0;
  }
  __return_storage_ptr__->rgb[0] = r;
  __return_storage_ptr__->rgb[1] = fVar6;
  __return_storage_ptr__->rgb[2] = fVar9;
  if (((fVar6 < r) || (fVar10 = r, fVar9 < r)) && ((r < fVar6 || (fVar10 = fVar6, fVar9 < fVar6))))
  {
    fVar10 = fVar9;
  }
  auVar1._4_4_ = -(uint)(r < fVar6);
  auVar1._0_4_ = -(uint)(r < fVar6);
  auVar1._8_4_ = -(uint)(r < fVar9);
  auVar1._12_4_ = -(uint)(r < fVar9);
  iVar3 = movmskpd(uVar2,auVar1);
  fVar13 = r;
  if ((iVar3 != 0) && ((fVar6 < r || (fVar13 = fVar6, fVar6 < fVar9)))) {
    fVar13 = fVar9;
  }
  __return_storage_ptr__->hsv[2] = fVar13;
  fVar12 = fVar13 - fVar10;
  fVar14 = 0.0;
  __return_storage_ptr__->hsv[1] = (float)(~-(uint)(fVar13 <= 0.0) & (uint)(fVar12 / fVar13));
  if ((fVar10 != fVar13) || (NAN(fVar10) || NAN(fVar13))) {
    if ((fVar13 != r) || (NAN(fVar13) || NAN(r))) {
      if ((fVar13 != fVar6) || (NAN(fVar13) || NAN(fVar6))) {
        if ((fVar13 != fVar9) || (NAN(fVar13) || NAN(fVar9))) {
          fVar14 = __return_storage_ptr__->hsv[0];
        }
        else {
          fVar14 = (r - fVar6) / fVar12 + 4.0;
        }
      }
      else {
        fVar14 = (fVar9 - r) / fVar12 + 2.0;
      }
    }
    else {
      dVar7 = fmod((double)((fVar6 - fVar9) / fVar12),6.0);
      fVar14 = (float)dVar7;
    }
  }
  __return_storage_ptr__->hsv[0] = fVar14 / 6.0;
  return __return_storage_ptr__;
}

Assistant:

static const GradientPoint fromRGB(float u, float r, float g, float b) {
    float min, max;
    GradientPoint out;
    out.units = u;

    // Rescale if max input range exceeds 1
    if (r > 1 || g > 1 || b > 1) {
      r /= 255;
      g /= 255;
      b /= 255;
    }

    out.rgb[0] = r;
    out.rgb[1] = g;
    out.rgb[2] = b;

    // Compute min/max RGB
    if (r <= g && r <= b) min = r;
    else if (g <= r && g <= b) min = g;
    else min = b;

    if (r >= g && r >= b) max = r;
    else if (g >= r && g >= b) max = g;
    else max = b;

    // Perform RGB->HSV conversion
    out.hsv[2] = max;
    float d = max - min;
    out.hsv[1] = (max <= 0) ? 0 : d / max;

    if (min == max) out.hsv[0] = 0;
    else {
      if (max == r) out.hsv[0] = fmod((g - b) / d, 6);
      else if (max == g) out.hsv[0] = (b - r) / d + 2;
      else if (max == b) out.hsv[0] = (r - g) / d + 4;
    }

    out.hsv[0] /= 6;
    return out;
  }